

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O2

void TestSplit(void)

{
  istream *this;
  InputBuffer *this_00;
  OutputBuffer *pOVar1;
  OutputBuffer part2;
  InputBuffer local_308;
  undefined8 *local_2f8;
  char *local_2f0;
  InputBuffer part1;
  size_t in;
  OutputBuffer buf;
  size_type local_2c0;
  string str;
  char *local_298;
  char *local_290;
  long local_288;
  char datain [12];
  char *local_270;
  char *local_268;
  const_string local_260;
  const_string local_250;
  char *local_240;
  char *local_238;
  const_string local_230;
  const_string local_220;
  const_string local_210;
  const_string local_200;
  char *local_1f0;
  char *local_1e8;
  const_string local_1e0;
  const_string local_1d0;
  istream is;
  
  str._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  str._M_string_length =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
       + 0x6d;
  str.field_2._M_allocated_capacity = 0x2ed;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&str);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  local_308.pimpl_.px = (element_type *)CONCAT71(local_308.pimpl_.px._1_7_,1);
  is.super_istream._M_gcount._0_1_ = 0;
  is.super_istream._vptr_basic_istream = (_func_int **)&PTR__lazy_ostream_001eabc8;
  is.super_istream._16_8_ = &boost::unit_test::lazy_ostream::inst;
  is.super_istream._24_8_ = anon_var_dwarf_90f61;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&local_308,(lazy_ostream *)&is);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,"This message is to be split",(allocator<char> *)&is);
  avro::OutputBuffer::OutputBuffer(&buf,0);
  avro::detail::BufferImpl::writeTo(buf.pimpl_.px,str._M_dataplus._M_p,str._M_string_length);
  avro::istream::istream(&is,&buf);
  this = &is;
  in = std::istream::readsome((char *)this,(long)datain);
  local_1d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1d0.m_end = "";
  local_1e0.m_begin = "";
  local_1e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_1d0,0x2f7,&local_1e0);
  this_00 = &local_308;
  local_308.pimpl_.pn.pi_._0_1_ = 0;
  local_308.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = "";
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1e8 = "";
  part2.pimpl_.px = (element_type *)0xc;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (this_00,&local_1f0,0x2f7,1,2,&in,"in",&part2,"sizeof(datain)");
  local_200.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_200.m_end = "";
  local_210.m_begin = "";
  local_210.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_200,0x2f8,&local_210);
  local_308.pimpl_.pn.pi_._0_1_ = 0;
  local_308.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = "";
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_290 = "";
  part2.pimpl_.px = (element_type *)std::istream::tellg();
  part1.pimpl_.px = (element_type *)0xc;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_308,&local_298,0x2f8,1,2,&part2,"static_cast<size_t>(is.tellg())",&part1,
             "sizeof(datain)");
  pOVar1 = &part2;
  avro::OutputBuffer::OutputBuffer(&part2,0);
  avro::OutputBuffer::append<avro::InputBuffer>(&part2,(InputBuffer *)&is.super_istream.field_0x50);
  local_220.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_220.m_end = "";
  local_230.m_begin = "";
  local_230.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar1,&local_220,0x2fc,&local_230);
  local_308.pimpl_.pn.pi_._0_1_ = 0;
  local_308.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = "";
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_238 = "";
  part1.pimpl_.px = (element_type *)(part2.pimpl_.px)->size_;
  local_2c0 = (buf.pimpl_.px)->size_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_308,&local_240,0x2fc,1,2,&part1,"part2.size()",&local_2c0,"buf.size()");
  std::istream::tellg();
  pOVar1 = (OutputBuffer *)&part1;
  avro::OutputBuffer::extractData(pOVar1,(size_type)&part2);
  local_250.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_250.m_end = "";
  local_260.m_begin = "";
  local_260.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pOVar1,&local_250,0x2ff,&local_260);
  local_308.pimpl_.pn.pi_._0_1_ = 0;
  local_308.pimpl_.px = (element_type *)&PTR__lazy_ostream_001ea848;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = "";
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_268 = "";
  local_2c0 = (part2.pimpl_.px)->size_;
  local_288 = str._M_string_length - in;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_308,&local_270,0x2ff,1,2,&local_2c0,"part2.size()",&local_288,"str.size() - in")
  ;
  printBuffer(&part1);
  avro::InputBuffer::InputBuffer(&local_308,&part2);
  printBuffer(&local_308);
  boost::detail::shared_count::~shared_count(&local_308.pimpl_.pn);
  boost::detail::shared_count::~shared_count(&part1.pimpl_.pn);
  boost::detail::shared_count::~shared_count(&part2.pimpl_.pn);
  avro::istream::~istream(&is);
  boost::detail::shared_count::~shared_count(&buf.pimpl_.pn);
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

void TestSplit()
{
    BOOST_TEST_MESSAGE( "TestSplit");
    {
        const std::string str = "This message is to be split";

        avro::OutputBuffer buf;
        buf.writeTo(str.c_str(), str.size()); 

        char datain[12];
        avro::istream is(buf);
        size_t in = static_cast<size_t>(is.readsome(datain, sizeof(datain)));
        BOOST_CHECK_EQUAL(in, sizeof(datain));
        BOOST_CHECK_EQUAL(static_cast<size_t>(is.tellg()), sizeof(datain));

        OutputBuffer part2;
        part2.append(is.getBuffer());
        BOOST_CHECK_EQUAL(part2.size(), buf.size());
        InputBuffer part1 = part2.extractData(static_cast<size_t>(is.tellg()));

        BOOST_CHECK_EQUAL(part2.size(), str.size() - in);

        printBuffer(part1);
        printBuffer(part2);
    }
}